

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O0

void __thiscall
StunMsg_RFC5769SampleIPv6Response_Test::TestBody(StunMsg_RFC5769SampleIPv6Response_Test *this)

{
  stun_msg_hdr *msg_hdr_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_460;
  Message local_458;
  undefined1 local_450 [8];
  AssertionResult gtest_ar_14;
  Message local_438;
  uint16_t local_42e;
  stun_attr_type local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_13;
  Message local_410;
  int local_408 [2];
  undefined1 local_400 [8];
  AssertionResult gtest_ar_12;
  Message local_3e8;
  uint16_t local_3de;
  stun_attr_type local_3dc;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_11;
  Message local_3c0;
  int local_3b8 [2];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_10;
  Message local_398;
  uint16_t local_38a;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_9;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_8;
  Message local_348;
  int local_340;
  stun_status_type local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_7;
  sockaddr_in6 test_addr;
  Message local_300;
  uint16_t local_2f6;
  stun_attr_type local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_6;
  AssertHelper local_2c0;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar__1;
  void *data;
  Message local_290;
  size_t local_288;
  unsigned_long local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_5;
  Message local_260;
  uint16_t local_256;
  stun_attr_type local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_4;
  stun_attr_hdr *attr_hdr;
  Message local_230;
  size_t local_228;
  unsigned_long local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_3;
  Message local_200;
  uint16_t local_1f6;
  stun_msg_type local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_1c0;
  Message local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_;
  Message local_198;
  int local_190 [2];
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_170;
  Message local_168 [3];
  unsigned_long local_150 [2];
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  sockaddr_in6 ipv6;
  uint8_t tsx_id [12];
  stun_msg_hdr *msg_hdr;
  uint8_t buffer [92];
  uint8_t expected_result [92];
  char cStack_34;
  char cStack_33;
  char cStack_32;
  char cStack_31;
  char password [23];
  char software_name [12];
  StunMsg_RFC5769SampleIPv6Response_Test *this_local;
  
  stack0xffffffffffffffe0 = 0x6365762074736574;
  password[8] = 'W';
  password[9] = 'v';
  password[10] = 'J';
  password[0xb] = 'x';
  password[0xc] = 'B';
  password[0xd] = 't';
  password[0xe] = '\0';
  builtin_memcpy(expected_result + 0x58,"VOkJ",4);
  cStack_34 = 'x';
  cStack_33 = 'b';
  cStack_32 = 'R';
  cStack_31 = 'l';
  password[0] = '1';
  password[1] = 'R';
  password[2] = 'm';
  password[3] = 'T';
  password[4] = 'x';
  password[5] = 'U';
  password[6] = 'k';
  password[7] = '/';
  expected_result[0x48] = 0xbf;
  expected_result[0x49] = 0xe3;
  expected_result[0x4a] = 0xed;
  expected_result[0x4b] = 'A';
  expected_result[0x4c] = 0x80;
  expected_result[0x4d] = '(';
  expected_result[0x4e] = '\0';
  expected_result[0x4f] = '\x04';
  expected_result[0x50] = 200;
  expected_result[0x51] = 0xfb;
  expected_result[0x52] = '\v';
  expected_result[0x53] = 'L';
  expected_result[0x38] = 0xa3;
  expected_result[0x39] = 0x82;
  expected_result[0x3a] = 0x95;
  expected_result[0x3b] = 'N';
  expected_result[0x3c] = 'K';
  expected_result[0x3d] = 0xe6;
  expected_result[0x3e] = '{';
  expected_result[0x3f] = 0xf1;
  expected_result[0x40] = '\x17';
  expected_result[0x41] = 0x84;
  expected_result[0x42] = 0xc9;
  expected_result[0x43] = '|';
  expected_result[0x44] = 0x82;
  expected_result[0x45] = 0x92;
  expected_result[0x46] = 0xc2;
  expected_result[0x47] = 'u';
  expected_result[0x28] = 0xa5;
  expected_result[0x29] = 0xd3;
  expected_result[0x2a] = 0xf1;
  expected_result[0x2b] = 'y';
  expected_result[0x2c] = 0xbc;
  expected_result[0x2d] = '%';
  expected_result[0x2e] = 0xf4;
  expected_result[0x2f] = 0xb5;
  expected_result[0x30] = 0xbe;
  expected_result[0x31] = 0xd2;
  expected_result[0x32] = 0xb9;
  expected_result[0x33] = 0xd9;
  expected_result[0x34] = '\0';
  expected_result[0x35] = '\b';
  expected_result[0x36] = '\0';
  expected_result[0x37] = '\x14';
  builtin_memcpy(expected_result + 0x18,"tor ",5);
  expected_result[0x1d] = ' ';
  expected_result[0x1e] = '\0';
  expected_result[0x1f] = '\x14';
  expected_result[0x20] = '\0';
  expected_result[0x21] = '\x02';
  expected_result[0x22] = 0xa1;
  expected_result[0x23] = 'G';
  expected_result[0x24] = '\x01';
  expected_result[0x25] = '\x13';
  expected_result[0x26] = 0xa9;
  expected_result[0x27] = 0xfa;
  expected_result[8] = 0xfa;
  expected_result[9] = 0x87;
  expected_result[10] = 0xdf;
  expected_result[0xb] = 0xae;
  expected_result[0xc] = 0x80;
  expected_result[0xd] = '\"';
  expected_result[0xe] = '\0';
  expected_result[0xf] = '\v';
  expected_result[0x10] = 't';
  expected_result[0x11] = 'e';
  expected_result[0x12] = 's';
  expected_result[0x13] = 't';
  expected_result[0x14] = ' ';
  expected_result[0x15] = 'v';
  expected_result[0x16] = 'e';
  expected_result[0x17] = 'c';
  stack0xffffffffffffff68 = 0x42a4122148000101;
  expected_result[0] = 0xb7;
  expected_result[1] = 0xe7;
  expected_result[2] = 0xa7;
  expected_result[3] = '\x01';
  expected_result[4] = 0xbc;
  expected_result[5] = '4';
  expected_result[6] = 0xd6;
  expected_result[7] = 0x86;
  ipv6._20_8_ = 0x86d634bc01a7e7b7;
  gtest_ar.message_.ptr_._4_2_ = 10;
  gtest_ar.message_.ptr_._6_2_ = htons(0x8055);
  inet_pton(10,"2001:db8:1234:5678:11:2233:4455:6677",&ipv6);
  local_150[1] = 0x5c;
  local_150[0] = 0x5c;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_140,"sizeof(expected_result)","sizeof(buffer)",local_150 + 1,
             local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_168);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x167,pcVar2);
    testing::internal::AssertHelper::operator=(&local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    testing::Message::~Message(local_168);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_190[1] = 1;
    local_190[0] = stun_msg_verify((stun_msg_hdr *)(buffer + 0x58),0x5c);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((EqHelper<false> *)local_188,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               local_190 + 1,local_190);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x169,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_198);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_198);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      stun_msg_hdr_init((stun_msg_hdr *)&msg_hdr,0x101,ipv6.sin6_addr.__in6_u.__u6_addr8 + 0xc);
      stun_attr_varsize_add((stun_msg_hdr *)&msg_hdr,0x8022,password + 0x10,0xb,' ');
      stun_attr_xor_sockaddr_add
                ((stun_msg_hdr *)&msg_hdr,0x20,(sockaddr *)((long)&gtest_ar.message_.ptr_ + 4));
      stun_attr_msgint_add((stun_msg_hdr *)&msg_hdr,expected_result + 0x58,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)&msg_hdr);
      anon_unknown.dwarf_39c4::IsEqual
                ((anon_unknown_dwarf_39c4 *)local_1b0,buffer + 0x58,&msg_hdr,0x5c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
      if (!bVar1) {
        testing::Message::Message(&local_1b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_2.message_,(internal *)local_1b0,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_1c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x174,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1c0);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1b8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
      msg_hdr_00 = (stun_msg_hdr *)(buffer + 0x58);
      local_1f4 = STUN_BINDING_RESPONSE;
      local_1f6 = stun_msg_type(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<stun_msg_type,unsigned_short>
                ((EqHelper<false> *)local_1f0,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
                 &local_1f4,&local_1f6);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
      if (!bVar1) {
        testing::Message::Message(&local_200);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x178,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_200);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_200);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
      local_220 = 0x5c;
      local_228 = stun_msg_len(msg_hdr_00);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_218,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 &local_220,&local_228);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
      if (!bVar1) {
        testing::Message::Message(&local_230);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&attr_hdr,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x179,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&attr_hdr,&local_230);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&attr_hdr);
        testing::Message::~Message(&local_230);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           stun_msg_next_attr(msg_hdr_00,(stun_attr_hdr *)0x0);
      local_254 = STUN_ATTR_SOFTWARE;
      local_256 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                ((EqHelper<false> *)local_250,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 &local_254,&local_256);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
      if (!bVar1) {
        testing::Message::Message(&local_260);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x17c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_260);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_260);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
      local_280 = 0xb;
      local_288 = stun_attr_len((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
      testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                ((EqHelper<false> *)local_278,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 &local_280,&local_288);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
      if (!bVar1) {
        testing::Message::Message(&local_290);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&data,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x17d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&data,&local_290);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&data);
        testing::Message::~Message(&local_290);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        gtest_ar__1.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_attr_varsize_read(gtest_ar_4.message_.ptr_);
        anon_unknown.dwarf_39c4::IsEqual
                  ((anon_unknown_dwarf_39c4 *)local_2b0,gtest_ar__1.message_.ptr_,password + 0x10,
                   0xb);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
        if (!bVar1) {
          testing::Message::Message(&local_2b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_6.message_,(internal *)local_2b0,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x17f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
          testing::internal::AssertHelper::~AssertHelper(&local_2c0);
          std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_2b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_2f4 = STUN_ATTR_XOR_MAPPED_ADDRESS;
        local_2f6 = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_2f0,"STUN_ATTR_XOR_MAPPED_ADDRESS",
                   "stun_attr_type(attr_hdr)",&local_2f4,&local_2f6);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
        if (!bVar1) {
          testing::Message::Message(&local_300);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&test_addr.sin6_scope_id,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x182,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&test_addr.sin6_scope_id,&local_300);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_addr.sin6_scope_id);
          testing::Message::~Message(&local_300);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
        test_addr.sin6_addr.__in6_u.__u6_addr32[0] = 0;
        test_addr.sin6_addr.__in6_u._4_8_ = 0;
        gtest_ar_7.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        test_addr.sin6_family = 0;
        test_addr.sin6_port = 0;
        test_addr.sin6_flowinfo = 0;
        local_33c = STUN_OK;
        local_340 = stun_attr_xor_sockaddr_read
                              ((stun_attr_xor_sockaddr *)gtest_ar_4.message_.ptr_,msg_hdr_00,
                               (sockaddr *)&gtest_ar_7.message_);
        testing::internal::EqHelper<false>::Compare<stun_status_type,int>
                  ((EqHelper<false> *)local_338,"STUN_OK",
                   "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
                   ,&local_33c,&local_340);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
        if (!bVar1) {
          testing::Message::Message(&local_348);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x186,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_8.message_,&local_348);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
          testing::Message::~Message(&local_348);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
        local_364 = 10;
        testing::internal::EqHelper<false>::Compare<int,unsigned_short>
                  ((EqHelper<false> *)local_360,"10","test_addr.sin6_family",&local_364,
                   (unsigned_short *)&gtest_ar_7.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
        if (!bVar1) {
          testing::Message::Message(&local_370);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x187,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_9.message_,&local_370);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
          testing::Message::~Message(&local_370);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
        local_38a = htons(0x8055);
        testing::internal::EqHelper<false>::Compare<unsigned_short,unsigned_short>
                  ((EqHelper<false> *)local_388,"htons(32853)","test_addr.sin6_port",&local_38a,
                   (unsigned_short *)((long)&gtest_ar_7.message_.ptr_ + 2));
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
        if (!bVar1) {
          testing::Message::Message(&local_398);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x188,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_10.message_,&local_398);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
          testing::Message::~Message(&local_398);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
        local_3b8[1] = 0;
        local_3b8[0] = memcmp(&test_addr,&ipv6,0x10);
        testing::internal::EqHelper<true>::Compare<int,int>
                  ((char *)local_3b0,"0",
                   (int *)"memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr, sizeof(ipv6.sin6_addr))",
                   local_3b8 + 1,local_3b8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
        if (!bVar1) {
          testing::Message::Message(&local_3c0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x18a,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_11.message_,&local_3c0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
          testing::Message::~Message(&local_3c0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_3dc = STUN_ATTR_MESSAGE_INTEGRITY;
        local_3de = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_3d8,"STUN_ATTR_MESSAGE_INTEGRITY",
                   "stun_attr_type(attr_hdr)",&local_3dc,&local_3de);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
        if (!bVar1) {
          testing::Message::Message(&local_3e8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x18d,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_12.message_,&local_3e8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
          testing::Message::~Message(&local_3e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
        local_408[1] = 1;
        local_408[0] = stun_attr_msgint_check
                                 ((stun_attr_msgint *)gtest_ar_4.message_.ptr_,msg_hdr_00,
                                  expected_result + 0x58,0x16);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_400,"1",
                   "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                   ,local_408 + 1,local_408);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
        if (!bVar1) {
          testing::Message::Message(&local_410);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,399,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_13.message_,&local_410);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
          testing::Message::~Message(&local_410);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        local_42c = STUN_ATTR_FINGERPRINT;
        local_42e = stun_attr_type((stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<false>::Compare<stun_attr_type,unsigned_short>
                  ((EqHelper<false> *)local_428,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                   &local_42c,&local_42e);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
        if (!bVar1) {
          testing::Message::Message(&local_438);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x192,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_14.message_,&local_438);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
          testing::Message::~Message(&local_438);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
        gtest_ar_4.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             stun_msg_next_attr(msg_hdr_00,gtest_ar_4.message_.ptr_);
        testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                  ((EqHelper<true> *)local_450,"__null","attr_hdr",(Secret *)0x0,
                   (_stun_attr_hdr *)gtest_ar_4.message_.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
        if (!bVar1) {
          testing::Message::Message(&local_458);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
          testing::internal::AssertHelper::AssertHelper
                    (&local_460,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x195,pcVar2);
          testing::internal::AssertHelper::operator=(&local_460,&local_458);
          testing::internal::AssertHelper::~AssertHelper(&local_460);
          testing::Message::~Message(&local_458);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
      }
    }
  }
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv6Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x48, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x14, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x02,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0x01,0x13,0xa9,0xfa, // }
    0xa5,0xd3,0xf1,0x79, // }  Xor'd mapped IPv6 address
    0xbc,0x25,0xf4,0xb5, // }
    0xbe,0xd2,0xb9,0xd9, // }
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0xa3,0x82,0x95,0x4e, // }
    0x4b,0xe6,0x7b,0xf1, // }
    0x17,0x84,0xc9,0x7c, // }  HMAC-SHA1 fingerprint
    0x82,0x92,0xc2,0x75, // }
    0xbf,0xe3,0xed,0x41, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc8,0xfb,0x0b,0x4c, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV6)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in6 ipv6;
  ipv6.sin6_family = AF_INET6;
  ipv6.sin6_port = htons(32853);
  inet_pton(AF_INET6, "2001:db8:1234:5678:11:2233:4455:6677", &ipv6.sin6_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));
  
  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr *)&ipv6);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in6 test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET6, test_addr.sin6_family);
  EXPECT_EQ(htons(32853), test_addr.sin6_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin6_addr, &ipv6.sin6_addr,
      sizeof(ipv6.sin6_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}